

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * QUnicodeTables::detachAndConvertCase<QString_const>
                    (QString *str,QStringIterator it,Case which)

{
  qint8 qVar1;
  bool bVar2;
  iterator pQVar3;
  QString *this;
  char *len;
  const_iterator pQVar4;
  long lVar5;
  QChar *after;
  int __c;
  int extraout_EDX;
  int extraout_EDX_00;
  int __c_00;
  char *in_RSI;
  char16_t *__s;
  QString *in_RDI;
  long in_FS_OFFSET;
  R_conflict14 RVar6;
  qsizetype outpos;
  qsizetype inpos;
  QChar *pp;
  QString *s;
  R_conflict14 folded;
  QString *in_stack_ffffffffffffff28;
  QString *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  qint8 in_stack_ffffffffffffff3e;
  qint8 in_stack_ffffffffffffff3f;
  long alen;
  undefined5 in_stack_ffffffffffffff60;
  qint8 in_stack_ffffffffffffff65;
  undefined1 uVar7;
  QStringIterator *this_00;
  char16_t *local_50;
  QChar local_2e;
  QChar local_2c;
  QChar local_2a;
  char16_t local_28 [4];
  undefined2 local_20;
  char16_t local_18 [4];
  undefined2 local_10;
  long local_8;
  
  this_00 = (QStringIterator *)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pQVar3 = QString::begin(in_stack_ffffffffffffff30);
  this = (QString *)QStringIterator::index(this_00,in_RSI,__c);
  local_50 = &pQVar3[(long)this].ucs;
  do {
    local_18 = (char16_t  [4])&DAT_aaaaaaaaaaaaaaaa;
    local_10 = 0xaaaa;
    QStringIterator::next
              ((QStringIterator *)
               CONCAT17(in_stack_ffffffffffffff3f,
                        CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
               (char32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    RVar6 = fullConvertCase((char32_t)((ulong)this_00 >> 0x20),(Case)this_00);
    local_28 = RVar6.chars;
    local_20 = CONCAT11(local_20._1_1_,RVar6.sz);
    local_10 = local_20;
    local_18 = local_28;
    qVar1 = R::size((R *)local_18);
    if (qVar1 < '\x02') {
      QChar::QChar<char16_t,_true>(&local_2e,local_18[0]);
      *local_50 = local_2e.ucs;
      local_50 = local_50 + 1;
    }
    else {
      QChar::QChar<char16_t,_true>(&local_2a,local_18[0]);
      __s = local_50;
      bVar2 = ::operator==((QChar *)in_stack_ffffffffffffff30,(QChar *)in_stack_ffffffffffffff28);
      uVar7 = false;
      __c_00 = extraout_EDX;
      if (bVar2) {
        in_stack_ffffffffffffff65 = R::size((R *)local_18);
        uVar7 = in_stack_ffffffffffffff65 == '\x02';
        __c_00 = extraout_EDX_00;
      }
      if ((bool)uVar7 == false) {
        len = QStringIterator::index(this_00,(char *)__s,__c_00);
        pQVar4 = QString::constBegin((QString *)0x52d515);
        lVar5 = (long)local_50 - (long)pQVar4 >> 1;
        alen = lVar5;
        after = (QChar *)R::data((R *)local_18);
        in_stack_ffffffffffffff3f = R::size((R *)local_18);
        QString::replace(this,CONCAT17(qVar1,CONCAT16(uVar7,CONCAT15(in_stack_ffffffffffffff65,
                                                                     in_stack_ffffffffffffff60))),
                         (qsizetype)len,after,alen);
        pQVar4 = QString::constBegin((QString *)0x52d586);
        in_stack_ffffffffffffff30 = (QString *)(pQVar4 + lVar5);
        in_stack_ffffffffffffff3e = R::size((R *)local_18);
        local_50 = (char16_t *)
                   ((long)&(in_stack_ffffffffffffff30->d).d +
                   (long)(int)in_stack_ffffffffffffff3e * 2);
      }
      else {
        pQVar3 = (iterator)(local_50 + 1);
        QChar::QChar<char16_t,_true>(&local_2c,local_18[1]);
        local_50 = local_50 + 2;
        pQVar3->ucs = local_2c.ucs;
      }
    }
    bVar2 = QStringIterator::hasNext((QStringIterator *)0x52d609);
  } while (bVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
static QString detachAndConvertCase(T &str, QStringIterator it, QUnicodeTables::Case which)
{
    Q_ASSERT(!str.isEmpty());
    QString s = std::move(str);         // will copy if T is const QString
    QChar *pp = s.begin() + it.index(); // will detach if necessary

    do {
        const auto folded = fullConvertCase(it.next(), which);
        if (Q_UNLIKELY(folded.size() > 1)) {
            if (folded.chars[0] == *pp && folded.size() == 2) {
                // special case: only second actually changed (e.g. surrogate pairs),
                // avoid slow case
                ++pp;
                *pp++ = folded.chars[1];
            } else {
                // slow path: the string is growing
                qsizetype inpos = it.index() - 1;
                qsizetype outpos = pp - s.constBegin();

                s.replace(outpos, 1, reinterpret_cast<const QChar *>(folded.data()), folded.size());
                pp = const_cast<QChar *>(s.constBegin()) + outpos + folded.size();

                // Adjust the input iterator if we are performing an in-place conversion
                if constexpr (!std::is_const<T>::value)
                    it = QStringIterator(s.constBegin(), inpos + folded.size(), s.constEnd());
            }
        } else {
            *pp++ = folded.chars[0];
        }
    } while (it.hasNext());

    return s;
}